

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

shared_ptr<opentracing::v3::Tracer> __thiscall
jaegertracing::Tracer::make
          (Tracer *this,string *serviceName,Config *config,
          shared_ptr<jaegertracing::logging::Logger> *logger,StatsFactory *statsFactory,int options)

{
  bool bVar1;
  Format FVar2;
  ulong uVar3;
  invalid_argument *this_00;
  W3CPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
  *this_01;
  HeadersConfig *pHVar4;
  W3CHTTPHeaderPropagator *this_02;
  JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
  *this_03;
  JaegerHTTPHeaderPropagator *this_04;
  Config *serviceName_00;
  Metrics *pMVar5;
  Config *serviceName_01;
  Tracer *this_05;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<opentracing::v3::Tracer> sVar7;
  shared_ptr<jaegertracing::Tracer> local_f8;
  undefined1 local_e8 [16];
  shared_ptr<jaegertracing::reporters::Reporter> reporter;
  undefined1 local_c8 [8];
  shared_ptr<jaegertracing::samplers::Sampler> sampler;
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
  local_a8;
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
  local_98;
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
  local_88;
  undefined1 local_78 [8];
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
  httpHeaderPropagator;
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
  textPropagator;
  shared_ptr<jaegertracing::metrics::Metrics> metrics;
  int options_local;
  StatsFactory *statsFactory_local;
  shared_ptr<jaegertracing::logging::Logger> *logger_local;
  Config *config_local;
  string *serviceName_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = Config::disabled(config);
    if (bVar1) {
      sVar7 = opentracing::v3::MakeNoopTracer();
      _Var6 = sVar7.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      std::make_shared<jaegertracing::metrics::Metrics,jaegertracing::metrics::StatsFactory&>
                ((StatsFactory *)
                 &textPropagator.
                  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::
      shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
      ::shared_ptr((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
                    *)&httpHeaderPropagator.
                       super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      std::
      shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
      ::shared_ptr((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                    *)local_78);
      FVar2 = Config::propagationFormat(config);
      if (FVar2 == W3C) {
        this_01 = (W3CPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                   *)operator_new(0xa0);
        pHVar4 = Config::headers(config);
        propagation::
        W3CPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
        ::Propagator(this_01,pHVar4,
                     (shared_ptr<jaegertracing::metrics::Metrics> *)
                     &textPropagator.
                      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>>
        ::
        shared_ptr<jaegertracing::propagation::W3CPropagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>,void>
                  ((shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>>
                    *)&local_88,this_01);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
        ::operator=((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
                     *)&httpHeaderPropagator.
                        super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,&local_88);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
        ::~shared_ptr(&local_88);
        this_02 = (W3CHTTPHeaderPropagator *)operator_new(0xa0);
        pHVar4 = Config::headers(config);
        propagation::W3CHTTPHeaderPropagator::Propagator
                  (this_02,pHVar4,
                   (shared_ptr<jaegertracing::metrics::Metrics> *)
                   &textPropagator.
                    super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>>
        ::shared_ptr<jaegertracing::propagation::W3CHTTPHeaderPropagator,void>
                  ((shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>>
                    *)&local_98,this_02);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
        ::operator=((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                     *)local_78,&local_98);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
        ::~shared_ptr(&local_98);
      }
      else {
        this_03 = (JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                   *)operator_new(0xa0);
        pHVar4 = Config::headers(config);
        propagation::
        JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
        ::Propagator(this_03,pHVar4,
                     (shared_ptr<jaegertracing::metrics::Metrics> *)
                     &textPropagator.
                      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>>
        ::
        shared_ptr<jaegertracing::propagation::JaegerPropagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>,void>
                  ((shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>>
                    *)&local_a8,this_03);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
        ::operator=((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
                     *)&httpHeaderPropagator.
                        super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,&local_a8);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
        ::~shared_ptr(&local_a8);
        this_04 = (JaegerHTTPHeaderPropagator *)operator_new(0xa0);
        pHVar4 = Config::headers(config);
        propagation::JaegerHTTPHeaderPropagator::Propagator
                  (this_04,pHVar4,
                   (shared_ptr<jaegertracing::metrics::Metrics> *)
                   &textPropagator.
                    super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>>
        ::shared_ptr<jaegertracing::propagation::JaegerHTTPHeaderPropagator,void>
                  ((shared_ptr<jaegertracing::propagation::Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>>
                    *)&sampler.
                       super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,this_04);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
        ::operator=((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                     *)local_78,
                    (shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                     *)&sampler.
                        super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
        std::
        shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
        ::~shared_ptr((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                       *)&sampler.
                          super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      }
      serviceName_00 = Config::sampler(config);
      pMVar5 = (Metrics *)
               std::
               __shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)logger);
      std::
      __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&textPropagator.
                      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
      samplers::Config::makeSampler
                ((Config *)
                 &reporter.
                  super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&serviceName_00->_type,(Logger *)serviceName,pMVar5);
      std::shared_ptr<jaegertracing::samplers::Sampler>::
      shared_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>,void>
                ((shared_ptr<jaegertracing::samplers::Sampler> *)local_c8,
                 (unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                  *)&reporter.
                     super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
      std::
      unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
      ::~unique_ptr((unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                     *)&reporter.
                        super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      serviceName_01 = Config::reporter(config);
      pMVar5 = (Metrics *)
               std::
               __shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)logger);
      std::
      __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&textPropagator.
                      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
      reporters::Config::makeReporter
                ((Config *)local_e8,(string *)serviceName_01,(Logger *)serviceName,pMVar5);
      std::shared_ptr<jaegertracing::reporters::Reporter>::
      shared_ptr<jaegertracing::reporters::Reporter,std::default_delete<jaegertracing::reporters::Reporter>,void>
                ((shared_ptr<jaegertracing::reporters::Reporter> *)(local_e8 + 8),
                 (unique_ptr<jaegertracing::reporters::Reporter,_std::default_delete<jaegertracing::reporters::Reporter>_>
                  *)local_e8);
      std::
      unique_ptr<jaegertracing::reporters::Reporter,_std::default_delete<jaegertracing::reporters::Reporter>_>
      ::~unique_ptr((unique_ptr<jaegertracing::reporters::Reporter,_std::default_delete<jaegertracing::reporters::Reporter>_>
                     *)local_e8);
      this_05 = (Tracer *)operator_new(0xb68);
      tags = Config::tags(config);
      Tracer(this_05,serviceName,(shared_ptr<jaegertracing::samplers::Sampler> *)local_c8,
             (shared_ptr<jaegertracing::reporters::Reporter> *)(local_e8 + 8),logger,
             (shared_ptr<jaegertracing::metrics::Metrics> *)
             &textPropagator.
              super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
              *)&httpHeaderPropagator.
                 super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount,
             (shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
              *)local_78,tags,options);
      std::shared_ptr<jaegertracing::Tracer>::shared_ptr<jaegertracing::Tracer,void>
                (&local_f8,this_05);
      std::shared_ptr<opentracing::v3::Tracer>::shared_ptr<jaegertracing::Tracer,void>
                ((shared_ptr<opentracing::v3::Tracer> *)this,&local_f8);
      std::shared_ptr<jaegertracing::Tracer>::~shared_ptr(&local_f8);
      std::shared_ptr<jaegertracing::reporters::Reporter>::~shared_ptr
                ((shared_ptr<jaegertracing::reporters::Reporter> *)(local_e8 + 8));
      std::shared_ptr<jaegertracing::samplers::Sampler>::~shared_ptr
                ((shared_ptr<jaegertracing::samplers::Sampler> *)local_c8);
      std::
      shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
      ::~shared_ptr((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
                     *)local_78);
      std::
      shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
      ::~shared_ptr((shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
                     *)&httpHeaderPropagator.
                        super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::shared_ptr<jaegertracing::metrics::Metrics>::~shared_ptr
                ((shared_ptr<jaegertracing::metrics::Metrics> *)
                 &textPropagator.
                  super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      _Var6._M_pi = extraout_RDX;
    }
    sVar7.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var6._M_pi;
    sVar7.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &this->super_Tracer;
    return (shared_ptr<opentracing::v3::Tracer>)
           sVar7.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"no service name provided");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<opentracing::Tracer>
Tracer::make(const std::string& serviceName,
                   const Config& config,
     const std::shared_ptr<logging::Logger>& logger,
     metrics::StatsFactory& statsFactory, int options)
{
    if (serviceName.empty()) {
        throw std::invalid_argument("no service name provided");
    }

    if (config.disabled()) {
        return opentracing::MakeNoopTracer();
    }

    auto metrics = std::make_shared<metrics::Metrics>(statsFactory);

    std::shared_ptr<TextMapPropagator> textPropagator;
    std::shared_ptr<HTTPHeaderPropagator> httpHeaderPropagator;
    if (config.propagationFormat() == propagation::Format::W3C) {
        textPropagator = std::shared_ptr<TextMapPropagator>(
            new propagation::W3CTextMapPropagator(config.headers(), metrics));
        httpHeaderPropagator = std::shared_ptr<HTTPHeaderPropagator>(
            new propagation::W3CHTTPHeaderPropagator(config.headers(),
                                                     metrics));
    }
    else {
        textPropagator = std::shared_ptr<TextMapPropagator>(
            new propagation::JaegerTextMapPropagator(config.headers(),
                                                     metrics));
        httpHeaderPropagator = std::shared_ptr<HTTPHeaderPropagator>(
            new propagation::JaegerHTTPHeaderPropagator(config.headers(),
                                                        metrics));
    }

    std::shared_ptr<samplers::Sampler> sampler(
        config.sampler().makeSampler(serviceName, *logger, *metrics));
    std::shared_ptr<reporters::Reporter> reporter(
        config.reporter().makeReporter(serviceName, *logger, *metrics));
    return std::shared_ptr<Tracer>(new Tracer(serviceName,
                                              sampler,
                                              reporter,
                                              logger,
                                              metrics,
                                              textPropagator,
                                              httpHeaderPropagator,
                                              config.tags(),
                                              options));
}